

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::ElemSegmentModuleField::~ElemSegmentModuleField(ElemSegmentModuleField *this)

{
  Expr *pEVar1;
  pointer pcVar2;
  _func_int ***ppp_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__ElemSegmentModuleField_0016cdb0;
  std::vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
  ::~vector(&(this->elem_segment).elem_exprs);
  pEVar1 = (this->elem_segment).offset.first_;
  while (pEVar1 != (Expr *)0x0) {
    ppp_Var3 = &pEVar1->_vptr_Expr;
    pEVar1 = (pEVar1->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var3)[1])();
  }
  (this->elem_segment).offset.first_ = (Expr *)0x0;
  (this->elem_segment).offset.last_ = (Expr *)0x0;
  (this->elem_segment).offset.size_ = 0;
  Var::~Var(&(this->elem_segment).table_var);
  pcVar2 = (this->elem_segment).name._M_dataplus._M_p;
  paVar4 = &(this->elem_segment).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    return;
  }
  operator_delete(pcVar2,paVar4->_M_allocated_capacity + 1);
  return;
}

Assistant:

explicit ElemSegmentModuleField(const Location& loc = Location(),
                                  std::string_view name = std::string_view())
      : ModuleFieldMixin<ModuleFieldType::ElemSegment>(loc),
        elem_segment(name) {}